

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,size_t depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *head;
  pointer pcVar1;
  cmMakefile *this_00;
  cmLinkInterface *pcVar2;
  string *sourceName;
  cmSourceFile *o;
  pointer pcVar3;
  cmLinkItem *obj;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar4;
  cmLinkItem libBT;
  
  head = (this->Targets).
         super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_start[depender_index];
  pcVar2 = cmGeneratorTarget::GetLinkInterface(dependee,config,head);
  if (pcVar2 != (cmLinkInterface *)0x0) {
    pcVar1 = (pcVar2->super_cmLinkInterfaceLibraries).Libraries.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar3 = (pcVar2->super_cmLinkInterfaceLibraries).Libraries.
                  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
      pVar4 = std::
              _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
              ::_M_insert_unique<cmLinkItem_const&>
                        ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                          *)emitted,pcVar3);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cmLinkItem::cmLinkItem(&libBT,pcVar3);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     *)&libBT.Backtrace,
                    (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     *)dependee_backtrace);
        AddTargetDepend(this,depender_index,&libBT,true,false);
        AddInterfaceDepends(this,depender_index,&libBT,config,emitted);
        cmLinkItem::~cmLinkItem(&libBT);
      }
    }
    pcVar1 = (pcVar2->super_cmLinkInterfaceLibraries).Objects.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar3 = (pcVar2->super_cmLinkInterfaceLibraries).Objects.
                  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
      this_00 = head->Makefile;
      sourceName = cmLinkItem::AsStr_abi_cxx11_(pcVar3);
      o = cmMakefile::GetSource(this_00,sourceName,Known);
      if (o != (cmSourceFile *)0x0) {
        AddObjectDepends(this,depender_index,o,emitted);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  size_t depender_index, const cmGeneratorTarget* dependee,
  cmListFileBacktrace const& dependee_backtrace, const std::string& config,
  std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (cmLinkItem const& lib : iface->Libraries) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(lib).second) {
        // Inject the backtrace of the original link dependency whose
        // link interface we are adding.  This indicates the line of
        // code in the project that caused this dependency to be added.
        cmLinkItem libBT = lib;
        libBT.Backtrace = dependee_backtrace;
        this->AddTargetDepend(depender_index, libBT, true, false);
        this->AddInterfaceDepends(depender_index, libBT, config, emitted);
      }
    }
    for (cmLinkItem const& obj : iface->Objects) {
      if (cmSourceFile const* o = depender->Makefile->GetSource(
            obj.AsStr(), cmSourceFileLocationKind::Known)) {
        this->AddObjectDepends(depender_index, o, emitted);
      }
    }
  }
}